

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

network_target *
new_network_target(stumpless_network_protocol network,stumpless_transport_protocol transport)

{
  network_target *target;
  char *__ptr;
  
  target = (network_target *)alloc_mem(0x50);
  if (target != (network_target *)0x0) {
    __ptr = copy_cstring("514");
    if (__ptr != (char *)0x0) {
      target->destination = (char *)0x0;
      target->port = __ptr;
      target->max_msg_size = 0x5c0;
      target->network = network;
      target->transport = transport;
      if ((network == STUMPLESS_IPV6_NETWORK_PROTOCOL) ||
         (network == STUMPLESS_IPV4_NETWORK_PROTOCOL)) {
        if ((transport == STUMPLESS_UDP_TRANSPORT_PROTOCOL) ||
           (transport == STUMPLESS_TCP_TRANSPORT_PROTOCOL)) {
          sys_socket_init_network_target(target);
          return target;
        }
        raise_transport_protocol_unsupported();
      }
      else {
        raise_network_protocol_unsupported();
      }
      free_mem(__ptr);
    }
    free_mem(target);
  }
  return (network_target *)0x0;
}

Assistant:

struct network_target *
new_network_target( enum stumpless_network_protocol network,
                    enum stumpless_transport_protocol transport ) {
  struct network_target *target;
  const char *port_copy;
  const struct network_target *init_result;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    goto fail;
  }

  port_copy = copy_cstring( STUMPLESS_DEFAULT_TRANSPORT_PORT );
  if( !port_copy ) {
    goto fail_port;
  }

  target->destination = NULL;
  target->port = port_copy;
  target->max_msg_size = STUMPLESS_DEFAULT_UDP_MAX_MESSAGE_SIZE;
  target->network = network;
  target->transport = transport;

  init_result = init_network_target( target );
  if( !init_result ) {
    goto fail_init;
  }

  return target;

fail_init:
  free_mem( port_copy );
fail_port:
  free_mem( target );
fail:
  return NULL;
}